

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brkiter.cpp
# Opt level: O0

int32_t __thiscall
icu_63::BreakIterator::getRuleStatusVec
          (BreakIterator *this,int32_t *fillInVec,int32_t capacity,UErrorCode *status)

{
  UBool UVar1;
  UErrorCode *status_local;
  int32_t capacity_local;
  int32_t *fillInVec_local;
  BreakIterator *this_local;
  
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    if (capacity < 1) {
      *status = U_BUFFER_OVERFLOW_ERROR;
      this_local._4_4_ = 1;
    }
    else {
      *fillInVec = 0;
      this_local._4_4_ = 1;
    }
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int32_t BreakIterator::getRuleStatusVec(int32_t *fillInVec, int32_t capacity, UErrorCode &status) {
    if (U_FAILURE(status)) {
        return 0;
    }
    if (capacity < 1) {
        status = U_BUFFER_OVERFLOW_ERROR;
        return 1;
    }
    *fillInVec = 0;
    return 1;
}